

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString BracketsFormattedHexStringFrom(long value)

{
  size_t extraout_RDX;
  char *in_RDI;
  SimpleString SVar1;
  SimpleString *in_stack_00000018;
  
  HexStringFrom((long)in_RDI);
  BracketsFormattedHexString(in_stack_00000018);
  SimpleString::~SimpleString((SimpleString *)0x112b19);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = in_RDI;
  return SVar1;
}

Assistant:

SimpleString BracketsFormattedHexStringFrom(long value)
{
    return BracketsFormattedHexString(HexStringFrom(value));
}